

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

void Assimp::FindAABBTransformed(aiMesh *mesh,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  aiVector3t<float> aVar1;
  undefined8 local_a0;
  float local_98;
  undefined8 local_80;
  float local_78;
  aiVector3t<float> local_60;
  undefined1 local_50 [8];
  aiVector3D v;
  uint i;
  float local_38;
  aiVector3t<float> local_34;
  aiMatrix4x4 *local_28;
  aiMatrix4x4 *m_local;
  aiVector3D *max_local;
  aiVector3D *min_local;
  aiMesh *mesh_local;
  
  local_28 = m;
  m_local = (aiMatrix4x4 *)max;
  max_local = min;
  min_local = (aiVector3D *)mesh;
  aiVector3t<float>::aiVector3t(&local_34,1e+11,1e+11,1e+11);
  max_local->x = local_34.x;
  max_local->y = local_34.y;
  max_local->z = local_34.z;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v.z,-1e+11,-1e+11,-1e+11);
  m_local->a1 = v.z;
  m_local->a2 = (float)i;
  m_local->a3 = local_38;
  for (v.y = 0.0; (uint)v.y < (uint)min_local->y; v.y = (float)((int)v.y + 1)) {
    aVar1 = ::operator*(local_28,(aiVector3t<float> *)
                                 (*(long *)&min_local[1].y + (ulong)(uint)v.y * 0xc));
    local_60.z = aVar1.z;
    v.x = local_60.z;
    local_60._0_8_ = aVar1._0_8_;
    local_50._0_4_ = local_60.x;
    local_50._4_4_ = local_60.y;
    aVar1 = std::min<float>((aiVector3t<float> *)local_50,max_local);
    local_78 = aVar1.z;
    local_80 = aVar1._0_8_;
    max_local->z = local_78;
    max_local->x = (float)(undefined4)local_80;
    max_local->y = (float)local_80._4_4_;
    aVar1 = std::max<float>((aiVector3t<float> *)local_50,(aiVector3t<float> *)m_local);
    local_a0 = aVar1._0_8_;
    local_98 = aVar1.z;
    m_local->a1 = (float)(undefined4)local_a0;
    m_local->a2 = (float)local_a0._4_4_;
    m_local->a3 = local_98;
  }
  return;
}

Assistant:

void FindAABBTransformed (const aiMesh* mesh, aiVector3D& min, aiVector3D& max,
    const aiMatrix4x4& m)
{
    min = aiVector3D ( ai_real( 10e10 ), ai_real( 10e10 ), ai_real( 10e10 ) );
    max = aiVector3D ( ai_real( -10e10 ), ai_real( -10e10 ), ai_real( -10e10 ) );
    for (unsigned int i = 0;i < mesh->mNumVertices;++i)
    {
        const aiVector3D v = m * mesh->mVertices[i];
        min = std::min(v,min);
        max = std::max(v,max);
    }
}